

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O0

void Qentem::Test::TestLoopUTag1(QTest *test)

{
  StringStream<char16_t> *pSVar1;
  Value<char16_t> *pVVar2;
  Value<char16_t> local_d0;
  Value<char16_t> local_b8;
  Value<char16_t> local_a0;
  undefined1 local_88 [8];
  Value<char16_t> value2;
  char16_t *content;
  Value<char16_t> value3;
  Value<char16_t> value1;
  StringStream<char16_t> ss;
  QTest *test_local;
  
  StringStream<char16_t>::StringStream((StringStream<char16_t> *)&value1.type_);
  Value<char16_t>::Value((Value<char16_t> *)&value3.type_);
  Value<char16_t>::Value((Value<char16_t> *)&content);
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,100);
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,-0x32);
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,L"Qentem");
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,true);
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,false);
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,(NullType)0x0);
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,3);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&value3.type_,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[41]>
            (test,pSVar1,(char16_t (*) [41])L"100, -50, Qentem, true, false, null, 3, ",0xb19);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>"
                      ,(Value<char16_t> *)&value3.type_,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[74]>
            (test,pSVar1,
             (char16_t (*) [74])
             L"100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 ",0xb1e);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  Value<char16_t>::Reset((Value<char16_t> *)&value3.type_);
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,0);
  Value<char16_t>::operator+=((Value<char16_t> *)&value3.type_,1);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
                      ,(Value<char16_t> *)&value3.type_,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[29]>
            (test,pSVar1,(char16_t (*) [29])L"(0: 0) (0: 1) (1: 0) (1: 1) ",0xb29);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
                      ,(Value<char16_t> *)&value3.type_,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[81]>
            (test,pSVar1,
             (char16_t (*) [81])
             L"(0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) ",
             0xb2f);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
                      ,(Value<char16_t> *)&value3.type_,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[209]>
            (test,pSVar1,
             (char16_t (*) [209])
             L"(0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) "
             ,0xb37);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  JSON::Parse<char16_t>((Value<char16_t> *)&value2.type_,L"[100, -50, \"A\", true, false, null]");
  Value<char16_t>::operator=((Value<char16_t> *)&value3.type_,(Value<char16_t> *)&value2.type_);
  Value<char16_t>::~Value((Value<char16_t> *)&value2.type_);
  JSON::Parse<char16_t>
            ((Value<char16_t> *)local_88,
             L"{\"k-1\": 4, \"k-2\":1.5, \"k-3\":\"ABC\", \"k-4\":true, \"k-5\":false, \"k-6\":null}"
            );
  pVVar2 = Value<char16_t>::operator[]((Value<char16_t> *)&content,L"arr1");
  Value<char16_t>::operator=(pVVar2,(Value<char16_t> *)&value3.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&value3.type_,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb44);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)local_88,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb48);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb4c);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pVVar2 = Value<char16_t>::operator[]((Value<char16_t> *)&content,L"arr1");
  Value<char16_t>::operator=(pVVar2,(Value<char16_t> *)local_88);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb52);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pVVar2 = Value<char16_t>::operator[]((Value<char16_t> *)&content,L"arr1");
  Value<char16_t>::operator=(pVVar2,(Value<char16_t> *)&value3.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\" >{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&value3.type_,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb59);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)local_88,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb5d);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb61);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pVVar2 = Value<char16_t>::operator[]((Value<char16_t> *)&content,L"arr1");
  Value<char16_t>::operator=(pVVar2,(Value<char16_t> *)local_88);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb67);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  Value<char16_t>::Reset((Value<char16_t> *)&content);
  pVVar2 = Value<char16_t>::operator[]((Value<char16_t> *)&content,L"arr1");
  pVVar2 = Value<char16_t>::operator[](pVVar2,L"arr2");
  pVVar2 = Value<char16_t>::operator[](pVVar2,L"arr3");
  Value<char16_t>::operator=(pVVar2,(Value<char16_t> *)&value3.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>"
                      ,(Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb6f);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  Value<char16_t>::Reset((Value<char16_t> *)&content);
  pVVar2 = Value<char16_t>::operator[]<int>((Value<char16_t> *)&content,0);
  pVVar2 = Value<char16_t>::operator[]<int>(pVVar2,0);
  Value<char16_t>::operator+=(pVVar2,(Value<char16_t> *)local_88);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb76);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  Value<char16_t>::Reset((Value<char16_t> *)&content);
  pVVar2 = Value<char16_t>::operator[]((Value<char16_t> *)&content,L"k1");
  pVVar2 = Value<char16_t>::operator[]<int>(pVVar2,0);
  pVVar2 = Value<char16_t>::operator[](pVVar2,L"k3");
  Value<char16_t>::operator=(pVVar2,(Value<char16_t> *)&value3.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (test,pSVar1,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb7d);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  Value<char16_t>::Reset((Value<char16_t> *)&content);
  pVVar2 = Value<char16_t>::operator[]<int>((Value<char16_t> *)&content,0);
  pVVar2 = Value<char16_t>::operator[](pVVar2,L"k2");
  Value<char16_t>::operator+=(pVVar2,(Value<char16_t> *)local_88);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>"
                      ,(Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[65]>
            (test,pSVar1,
             (char16_t (*) [65])L"4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, ",
             0xb85);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  JSON::Parse<char16_t>(&local_a0,L"{\"group\":[[10],[20],[30]]}");
  Value<char16_t>::operator=((Value<char16_t> *)&content,&local_a0);
  Value<char16_t>::~Value(&local_a0);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
                      ,(Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (test,pSVar1,(char16_t (*) [7])L"102030",0xb8b);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  JSON::Parse<char16_t>(&local_b8,L"{\"group\":[1,2,3,4]}");
  Value<char16_t>::operator=((Value<char16_t> *)&content,&local_b8);
  Value<char16_t>::~Value(&local_b8);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (test,pSVar1,(char16_t (*) [5])L"1234",0xb91);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  JSON::Parse<char16_t>(&local_d0,L"{\"numbers\":[1,2,3,4,5,6,7,8]}");
  Value<char16_t>::operator=((Value<char16_t> *)&content,&local_d0);
  Value<char16_t>::~Value(&local_d0);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,pSVar1,(char16_t (*) [11])L"A12345678B",0xb96);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  pSVar1 = Template::Render<char16_t,Qentem::Value<char16_t>,Qentem::StringStream<char16_t>>
                     (L"<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>",
                      (Value<char16_t> *)&content,(StringStream<char16_t> *)&value1.type_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[113]>
            (test,pSVar1,
             (char16_t (*) [113])
             L"{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}"
             ,0xb9d);
  StringStream<char16_t>::Clear((StringStream<char16_t> *)&value1.type_);
  Value<char16_t>::~Value((Value<char16_t> *)local_88);
  Value<char16_t>::~Value((Value<char16_t> *)&content);
  Value<char16_t>::~Value((Value<char16_t> *)&value3.type_);
  StringStream<char16_t>::~StringStream((StringStream<char16_t> *)&value1.type_);
  return;
}

Assistant:

static void TestLoopUTag1(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value1;
    Value<char16_t>        value3;
    const char16_t        *content;

    value1 += 100;
    value1 += -50;
    value1 += uR"(Qentem)";
    value1 += true;
    value1 += false;
    value1 += nullptr;
    value1 += 3;

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, Qentem, true, false, null, 3, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value    =    "loop1-value">{var:loop1-value}, {var:loop1-value} </loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 uR"(100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 )", __LINE__);
    ss.Clear();

    ////////////////

    value1.Reset();
    value1 += 0;
    value1 += 1;

    content =
        uR"(<loop value="loop1-value"><loop value="loop2-value">({var:loop1-value}: {var:loop2-value}) </loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"((0: 0) (0: 1) (1: 0) (1: 1) )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value"><loop value="loop2-value"><loop
                 value="loop3-value">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 uR"((0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) )", __LINE__);
    ss.Clear();

    content = uR"(<loop value='loop1-value'><loop value='loop2-value'><loop
                 value='loop3-value'><loop value='loop4-value'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>)";
    test.IsEqual(
        Template::Render(content, value1, ss),
        uR"((0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) )",
        __LINE__);
    ss.Clear();

    //////////////////////

    value1 = JSON::Parse(uR"([100, -50, "A", true, false, null])");
    const Value<char16_t> value2 =
        JSON::Parse(uR"({"k-1": 4, "k-2":1.5, "k-3":"ABC", "k-4":true, "k-5":false, "k-6":null})");

    //////////////////////
    value3[uR"(arr1)"] = value1;

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[uR"(arr1)"] = value2;

    content = uR"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3[uR"(arr1)"] = value1;

    content = uR"(<loop value="loop1-value" >{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value"set="arr1">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[uR"(arr1)"] = value2;

    content = uR"(<loop set='arr1' value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3.Reset();
    value3[uR"(arr1)"][uR"(arr2)"][uR"(arr3)"] = value1;

    content = uR"(<loop set="arr1[arr2][arr3]" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][0] += value2;

    content = uR"(<loop set="0[0][0]"value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[uR"(k1)"][0][uR"(k3)"] = value1;

    content = uR"(<loop value="loop1-value" set="k1[0][k3]">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][uR"(k2)"] += value2;

    content = uR"(<loop set="0[k2][0]"value="loop1-value">{var:loop1-value}, {var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss),
                 uR"(4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, )", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(uR"({"group":[[10],[20],[30]]})");

    content = uR"(<loop set="group" value="Val_1"><loop set="Val_1" value="Val_2">{var:Val_2}</loop></loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(102030)", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(uR"({"group":[1,2,3,4]})");

    content = uR"(<loop set="group" value="Val_">{var:Val_}</loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(1234)", __LINE__);
    ss.Clear();

    value3  = JSON::Parse(uR"({"numbers":[1,2,3,4,5,6,7,8]})");
    content = uR"(A<loop set="numbers" value="l_id1">{var:l_id1}</loop>B)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(A12345678B)", __LINE__);
    ss.Clear();

    content = uR"(<loop set="numbers" value="l_id1">{var:l_id1[0]}</loop>)";
    test.IsEqual(
        Template::Render(content, value3, ss),
        uR"({var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]})",
        __LINE__);
    ss.Clear();
}